

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::MhsReader::MhsReader(MhsReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppIVar2;
  pointer *pppEVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar4;
  pointer pcVar5;
  iterator iVar6;
  ADIOS *this_01;
  IO *this_02;
  _Alloc_hider _Var7;
  size_type sVar8;
  uint uVar9;
  long *plVar10;
  undefined8 *puVar11;
  uint uVar12;
  size_type *psVar13;
  ulong uVar14;
  uint uVar15;
  IO *this_03;
  uint uVar16;
  uint uVar17;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_2;
  Params params;
  undefined1 local_178 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *local_110;
  vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *local_108;
  int *local_100;
  IO *local_f8;
  Comm local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  Engine *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"MhsReader","");
  helper::Comm::Comm(&local_f0,comm);
  local_f8 = io;
  Engine::Engine(&this->super_Engine,&local_a0,io,name,mode,&local_f0);
  helper::Comm::~Comm(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsReader_008760c0;
  local_108 = (vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_SubIOs;
  local_110 = (vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
              &this->m_SubEngines;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar1 = &local_158.first.field_2;
  local_158.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Tiers","");
  local_100 = &this->m_Tiers;
  helper::GetParameter<int>(&local_f8->m_Parameters,&local_158.first,local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.first._M_dataplus._M_p);
  }
  uVar15 = *local_100;
  uVar16 = -uVar15;
  if (0 < (int)uVar15) {
    uVar16 = uVar15;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar14 = (ulong)uVar16;
    uVar9 = 4;
    do {
      uVar17 = uVar9;
      uVar12 = (uint)uVar14;
      if (uVar12 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_006c3774;
      }
      if (uVar12 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_006c3774;
      }
      if (uVar12 < 10000) goto LAB_006c3774;
      uVar14 = uVar14 / 10000;
      uVar9 = uVar17 + 4;
    } while (99999 < uVar12);
    uVar17 = uVar17 + 1;
  }
LAB_006c3774:
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_178,(char)uVar17 - (char)((int)uVar15 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_178._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar17,uVar16);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_158,(char (*) [6])"Tiers",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_e8,(allocator_type *)&local_c8);
  this_03 = local_f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.second._M_dataplus._M_p != &local_158.second.field_2) {
    operator_delete(local_158.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.first._M_dataplus._M_p);
  }
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  local_158.first._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::compress::CompressSirius,std::allocator<adios2::core::compress::CompressSirius>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.first._M_string_length,
             (CompressSirius **)&local_158,
             (allocator<adios2::core::compress::CompressSirius> *)local_178,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  sVar8 = local_158.first._M_string_length;
  _Var7._M_p = local_158.first._M_dataplus._M_p;
  local_158.first._M_dataplus._M_p = (pointer)0x0;
  local_158.first._M_string_length = 0;
  this_00 = (this->m_SiriusCompressor).
            super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_p;
  (this->m_SiriusCompressor).
  super___shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar8;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.first._M_string_length);
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  IO::SetEngine(this_03,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_158.first._M_dataplus._M_p = (pointer)this_03;
  iVar4._M_current =
       (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
    _M_realloc_insert<adios2::core::IO*>(local_108,iVar4,(IO **)&local_158);
  }
  else {
    *iVar4._M_current = this_03;
    pppIVar2 = &(this->m_SubIOs).
                super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar2 = *pppIVar2 + 1;
  }
  pcVar5 = (this->super_Engine).m_Name._M_dataplus._M_p;
  local_158.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar5,pcVar5 + (this->super_Engine).m_Name._M_string_length);
  std::__cxx11::string::append((char *)&local_158);
  local_178._0_8_ = IO::Open(this_03,&local_158.first,Read);
  iVar6._M_current =
       (this->m_SubEngines).
       super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_SubEngines).
      super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
    _M_realloc_insert<adios2::core::Engine*>(local_110,iVar6,(Engine **)local_178);
  }
  else {
    *iVar6._M_current = (Engine *)local_178._0_8_;
    pppEVar3 = &(this->m_SubEngines).
                super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar3 = *pppEVar3 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.first._M_dataplus._M_p);
  }
  if (1 < *local_100) {
    uVar15 = 1;
    do {
      uVar16 = 1;
      if (9 < uVar15) {
        uVar14 = (ulong)uVar15;
        uVar17 = 4;
        do {
          uVar16 = uVar17;
          uVar9 = (uint)uVar14;
          if (uVar9 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_006c39e5;
          }
          if (uVar9 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_006c39e5;
          }
          if (uVar9 < 10000) goto LAB_006c39e5;
          uVar14 = uVar14 / 10000;
          uVar17 = uVar16 + 4;
        } while (99999 < uVar9);
        uVar16 = uVar16 + 1;
      }
LAB_006c39e5:
      this_01 = this_03->m_ADIOS;
      local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_158.first._M_dataplus._M_p,uVar16,uVar15);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x757564);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_c0.field_2._M_allocated_capacity = *psVar13;
        local_c0.field_2._8_8_ = plVar10[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar13;
        local_c0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_c0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_178._0_8_ = ADIOS::DeclareIO(this_01,&local_c0,Auto);
      iVar4._M_current =
           (this->m_SubIOs).
           super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_SubIOs).
          super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
        _M_realloc_insert<adios2::core::IO*>(local_108,iVar4,(IO **)local_178);
      }
      else {
        *iVar4._M_current = (IO *)local_178._0_8_;
        pppIVar2 = &(this->m_SubIOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar2 = *pppIVar2 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
        operator_delete(local_158.first._M_dataplus._M_p);
      }
      this_02 = (this->m_SubIOs).
                super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      local_178._0_8_ = local_178 + 0x10;
      pcVar5 = (this->super_Engine).m_Name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,pcVar5,pcVar5 + (this->super_Engine).m_Name._M_string_length);
      std::__cxx11::string::append((char *)local_178);
      uVar16 = 1;
      if (9 < uVar15) {
        uVar14 = (ulong)uVar15;
        uVar17 = 4;
        do {
          uVar16 = uVar17;
          uVar9 = (uint)uVar14;
          if (uVar9 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_006c3b8a;
          }
          if (uVar9 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_006c3b8a;
          }
          if (uVar9 < 10000) goto LAB_006c3b8a;
          uVar14 = uVar14 / 10000;
          uVar17 = uVar16 + 4;
        } while (99999 < uVar9);
        uVar16 = uVar16 + 1;
      }
LAB_006c3b8a:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,uVar16,uVar15);
      this_03 = local_f8;
      uVar14 = 0xf;
      if ((Engine *)local_178._0_8_ != (Engine *)(local_178 + 0x10)) {
        uVar14 = local_178._16_8_;
      }
      if (uVar14 < (ulong)(local_e0 + local_178._8_8_)) {
        uVar14 = 0xf;
        if (local_e8 != local_d8) {
          uVar14 = local_d8[0];
        }
        if (uVar14 < (ulong)(local_e0 + local_178._8_8_)) goto LAB_006c3c1f;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_178._0_8_);
      }
      else {
LAB_006c3c1f:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_178,(ulong)local_e8);
      }
      local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar1) {
        local_158.first.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_158.first.field_2._8_8_ = puVar11[3];
      }
      else {
        local_158.first.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_158.first._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_158.first._M_string_length = puVar11[1];
      *puVar11 = paVar1;
      puVar11[1] = 0;
      paVar1->_M_local_buf[0] = '\0';
      local_c8 = IO::Open(this_02,&local_158.first,Read);
      iVar6._M_current =
           (this->m_SubEngines).
           super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_SubEngines).
          super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
        _M_realloc_insert<adios2::core::Engine*>(local_110,iVar6,&local_c8);
      }
      else {
        *iVar6._M_current = local_c8;
        pppEVar3 = &(this->m_SubEngines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar3 = *pppEVar3 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
        operator_delete(local_158.first._M_dataplus._M_p);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if ((Engine *)local_178._0_8_ != (Engine *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_);
      }
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 < *local_100);
  }
  (this->super_Engine).m_IsOpen = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

MhsReader::MhsReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("MhsReader", io, name, mode, std::move(comm))
{
    helper::GetParameter(io.m_Parameters, "Tiers", m_Tiers);
    Params params = {{"Tiers", std::to_string(m_Tiers)}};
    m_SiriusCompressor = std::make_shared<compress::CompressSirius>(params);
    io.SetEngine("");
    m_SubIOs.emplace_back(&io);
    m_SubEngines.emplace_back(&io.Open(m_Name + ".tier0", adios2::Mode::Read));

    for (int i = 1; i < m_Tiers; ++i)
    {
        m_SubIOs.emplace_back(&io.m_ADIOS.DeclareIO("SubIO" + std::to_string(i)));
        m_SubEngines.emplace_back(
            &m_SubIOs.back()->Open(m_Name + ".tier" + std::to_string(i), adios2::Mode::Read));
    }
    m_IsOpen = true;
}